

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::OutputFile::Data::Data(Data *this,int numThreads)

{
  undefined4 in_ESI;
  long in_RDI;
  size_type __new_size;
  vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  *this_00;
  undefined8 in_stack_ffffffffffffffc8;
  Compression compression;
  LineOrder in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  V2f *in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  
  compression = (Compression)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  Imath_3_2::Vec2<float>::Vec2((Vec2<float> *)&stack0xffffffffffffffec,0.0,0.0);
  Header::Header((Header *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)in_stack_ffffffffffffffec
                 ,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
                 in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,compression);
  FrameBuffer::FrameBuffer((FrameBuffer *)0x215052);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x215068);
  __new_size = in_RDI + 0xb0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x21507e);
  this_00 = (vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
             *)(in_RDI + 200);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x215094);
  std::
  vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
  ::vector((vector<Imf_3_4::(anonymous_namespace)::OutSliceInfo,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo>_>
            *)0x2150aa);
  *(undefined8 *)(in_RDI + 0x100) = 0;
  std::
  vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ::vector((vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
            *)0x2150d3);
  *(undefined4 *)(in_RDI + 0x130) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x138) = 0;
  *(undefined1 *)(in_RDI + 0x140) = 0;
  std::max<int>((int *)&stack0xffffffffffffffe8,(int *)&stack0xffffffffffffffe4);
  std::
  vector<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
  ::resize(this_00,__new_size);
  return;
}

Assistant:

OutputFile::Data::Data (int numThreads)
    : lineOffsetsPosition (0)
    , partNumber (-1)
    , _streamData (0)
    , _deleteStream (false)
{
    //
    // We need at least one lineBuffer, but if threading is used,
    // to keep n threads busy we need 2*n lineBuffers.
    //

    lineBuffers.resize (max (1, 2 * numThreads));
}